

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_transaction_AddSignConfidentialTxEmptyWitnessSimple_Test::TestBody
          (cfdcapi_elements_transaction_AddSignConfidentialTxEmptyWitnessSimple_Test *this)

{
  bool bVar1;
  char *in_R9;
  char *pcVar2;
  AssertHelper local_90;
  int ret;
  AssertHelper local_80;
  char *signature;
  char *sighash;
  char *tx_string2;
  AssertionResult gtest_ar;
  undefined1 local_50 [16];
  void *handle;
  char *tx_string;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  tx_string = (char *)((ulong)tx_string._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_string);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_string2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x583,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_string2,(Message *)&tx_string);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string2);
    if (tx_string != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_string != (char *)0x0)) {
        (**(code **)(*(long *)tx_string + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  tx_string = (char *)CONCAT71(tx_string._1_7_,handle != (void *)0x0);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_string2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&tx_string,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sighash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x584,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&sighash,(Message *)&tx_string2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sighash);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_50) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (tx_string2 != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_string2 != (char *)0x0)) {
        (**(code **)(*(long *)tx_string2 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  tx_string = (char *)0x0;
  tx_string2 = (char *)0x0;
  pcVar2 = "";
  ret = CfdAddTxSign(handle,0xb,
                     "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                     ,"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,5,"",
                     false,0,false,true,&tx_string);
  sighash = (char *)((ulong)sighash._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&sighash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sighash);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x58c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)&sighash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    if (sighash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (sighash != (char *)0x0)) {
        (**(code **)(*(long *)sighash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    sighash = (char *)0x0;
    signature = (char *)0x0;
    ret = CfdCreateConfidentialSighash
                    (handle,tx_string,
                     "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,5,
                     (char *)0x0,
                     "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae"
                     ,13000000000000,(char *)0x0,1,false,&sighash);
    local_90.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_90);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x595,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f\"","sighash",
                 "d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f",sighash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x597,pcVar2);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ret = CfdCalculateEcSignature
                      (handle,sighash,(char *)0x0,
                       "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR",2,true,&signature);
      local_90.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x59b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (ret == 0) {
        ret = CfdAddTxSign(handle,0xb,tx_string,
                           "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,5,
                           signature,true,1,false,false,&tx_string2);
        local_90.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_90);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x5a1,pcVar2);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer(signature);
        if (ret == 0) {
          CfdFreeStringBuffer(tx_string);
          tx_string = (char *)0x0;
          ret = CfdCalculateEcSignature
                          (handle,sighash,(char *)0x0,
                           "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi",2,true,&signature)
          ;
          local_90.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_90);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x5ac,pcVar2);
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_80);
            if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (ret == 0) {
            ret = CfdAddTxSign(handle,0xb,tx_string2,
                               "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,
                               5,signature,true,1,false,false,&tx_string);
            local_90.data_._0_4_ = 0;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_90);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x5b2,pcVar2);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
              testing::internal::AssertHelper::~AssertHelper(&local_80);
              if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            CfdFreeStringBuffer(signature);
            if (ret == 0) {
              CfdFreeStringBuffer(tx_string2);
              tx_string2 = (char *)0x0;
              ret = CfdAddScriptHashSign
                              (handle,0xb,tx_string,
                               "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,
                               5,
                               "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae"
                               ,false,&tx_string2);
              local_90.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_90);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x5bf,pcVar2);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (ret == 0) {
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,
                           "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000\""
                           ,"tx_string2",
                           "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000"
                           ,tx_string2);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_90);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x5c2,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
                  testing::internal::AssertHelper::~AssertHelper(&local_80);
                  if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) &&
                       ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0))
                    {
                      (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8)
                      )();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
            }
          }
        }
      }
    }
    CfdFreeStringBuffer(sighash);
    CfdFreeStringBuffer(tx_string);
    CfdFreeStringBuffer(tx_string2);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    sighash = (char *)0x0;
    ret = CfdGetLastErrorMessage(handle,&sighash);
    signature = (char *)((ulong)signature & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&signature,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&signature);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x5ce,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&signature);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (signature != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (signature != (char *)0x0)) {
          (**(code **)(*(long *)signature + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",sighash);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&signature);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x5cf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&signature);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (signature != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (signature != (char *)0x0)) {
          (**(code **)(*(long *)signature + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer(sighash);
  }
  ret = CfdFreeHandle(handle);
  sighash = (char *)((ulong)sighash & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&sighash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sighash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x5d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)&sighash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    if (sighash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (sighash != (char *)0x0)) {
        (**(code **)(*(long *)sighash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddSignConfidentialTxEmptyWitnessSimple) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";
  // static const char* pubkey1 = "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad";
  static const char* privkey1 = "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi";
  // static const char* pubkey2 = "02bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d71";
  static const char* privkey2 = "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR";
  static const char* multisig_script = "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  ret = CfdAddTxSign(
    handle, kCfdNetworkElementsRegtest, kTxData,
    "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
    kCfdP2shP2wsh, "", false, 0, false, true, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    char* sighash = nullptr;
    int64_t satoshi = 13000000000000;
    char* signature = nullptr;
    ret = CfdCreateConfidentialSighash(
        handle, tx_string, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        kCfdP2shP2wsh, nullptr, multisig_script, satoshi, nullptr, kCfdSigHashAll, false, &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f", sighash);

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey2, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddTxSign(
          handle, kCfdNetworkElementsRegtest, tx_string,
          "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
          kCfdP2shP2wsh, signature, true, kCfdSigHashAll, false, false, &tx_string2);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      CfdFreeStringBuffer(tx_string);
      tx_string = nullptr;

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey1, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddTxSign(
          handle, kCfdNetworkElementsRegtest, tx_string2,
          "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
          kCfdP2shP2wsh, signature, true, kCfdSigHashAll, false, false, &tx_string);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      CfdFreeStringBuffer(tx_string2);
      tx_string2 = nullptr;

      ret = CfdAddScriptHashSign(
        handle, kCfdNetworkElementsRegtest, tx_string,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        kCfdP2shP2wsh, multisig_script, false, &tx_string2);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000", tx_string2);
    }
    CfdFreeStringBuffer(sighash);

    CfdFreeStringBuffer(tx_string);
    CfdFreeStringBuffer(tx_string2);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}